

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  bool bVar1;
  size_t local_50;
  size_t consumed;
  size_t sStack_40;
  int ret;
  size_t decryptbuf_orig_size;
  uint8_t *end;
  uint8_t *input;
  size_t *inlen_local;
  void *_input_local;
  ptls_buffer_t *decryptbuf_local;
  ptls_t *tls_local;
  
  decryptbuf_orig_size = (long)_input + *inlen;
  sStack_40 = decryptbuf->off;
  consumed._4_4_ = 0;
  end = (uint8_t *)_input;
  input = (uint8_t *)inlen;
  inlen_local = (size_t *)_input;
  _input_local = decryptbuf;
  decryptbuf_local = (ptls_buffer_t *)tls;
  if (PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY < tls->state) {
    while( true ) {
      bVar1 = false;
      if ((consumed._4_4_ == 0) && (bVar1 = false, end != (uint8_t *)decryptbuf_orig_size)) {
        bVar1 = sStack_40 == *(size_t *)((long)_input_local + 0x10);
      }
      if (!bVar1) break;
      local_50 = decryptbuf_orig_size - (long)end;
      if ((decryptbuf_local[5].off & 1) == 0) {
        consumed._4_4_ =
             handle_input((ptls_t *)decryptbuf_local,(ptls_message_emitter_t *)0x0,
                          (ptls_buffer_t *)_input_local,end,&local_50,
                          (ptls_handshake_properties_t *)0x0);
      }
      else {
        consumed._4_4_ =
             handle_input_tls12((ptls_t *)decryptbuf_local,(ptls_buffer_t *)_input_local,end,
                                &local_50);
      }
      end = end + local_50;
      if (((consumed._4_4_ != 0) && (consumed._4_4_ != 0x100)) && (consumed._4_4_ == 0x202)) {
        consumed._4_4_ = 0;
      }
    }
    *(size_t *)input = *(long *)input - (decryptbuf_orig_size - (long)end);
    return consumed._4_4_;
  }
  __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                ,0x17c7,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        if (tls->traffic_protection.dec.tls12) {
            ret = handle_input_tls12(tls, decryptbuf, input, &consumed);
        } else {
            ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        }
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}